

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

void __thiscall QAccessibleComboBox::doAction(QAccessibleComboBox *this,QString *actionName)

{
  bool bVar1;
  QComboBox *this_00;
  QString *pQVar2;
  QAbstractItemView *pQVar3;
  
  this_00 = comboBox(this);
  if (this_00 == (QComboBox *)0x0) {
    return;
  }
  pQVar2 = (QString *)QAccessibleActionInterface::showMenuAction();
  bVar1 = ::comparesEqual(actionName,pQVar2);
  if (!bVar1) {
    pQVar2 = (QString *)QAccessibleActionInterface::pressAction();
    bVar1 = ::comparesEqual(actionName,pQVar2);
    if (!bVar1) {
      return;
    }
  }
  pQVar3 = QComboBox::view(this_00);
  (**(code **)(*(long *)&this_00->super_QWidget + 0x1a8 +
              (ulong)(ushort)((ushort)((pQVar3->super_QAbstractScrollArea).super_QFrame.
                                       super_QWidget.data)->widget_attributes >> 0xf) * 8))(this_00)
  ;
  return;
}

Assistant:

void QAccessibleComboBox::doAction(const QString &actionName)
{
    if (QComboBox *cBox = comboBox()) {
        if (actionName == showMenuAction() || actionName == pressAction()) {
            if (cBox->view()->isVisible()) {
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    cBox->setCurrentIndex(list->selectedRows().at(0));
                }
                cBox->setFocus();
#endif
                cBox->hidePopup();
            } else {
                cBox->showPopup();
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    auto selectedCells = list->selectedCells();
                    QAccessibleEvent ev(selectedCells.at(0),QAccessible::Focus);
                    QAccessible::updateAccessibility(&ev);
                }
#endif
            }
        }
    }
}